

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

void __thiscall Minisat::SimpSolver::diversify(SimpSolver *this,int rank,int size)

{
  if (size + -2 <= rank && 1 < rank) {
    this->use_simplification = false;
  }
  if (size + -4 <= rank && 1 < rank) {
    this->grow = 8;
  }
  if (size + -5 <= rank && 1 < rank) {
    this->clause_lim = 0x28;
  }
  Solver::diversify(&this->super_Solver,rank,size);
  if (this->use_simplification != false) {
    return;
  }
  eliminate(this,false);
  return;
}

Assistant:

void SimpSolver::diversify(int rank, int size)
{
    /* rank ranges from 0 to size-1 */

    /* keep first 2 configurations as is,
       and disable simplification for last 2 configurations */
    if (rank > 1 && rank >= size - 2) use_simplification = false;

    /* allow higher grow value for last 2 configurations with simplfication */
    if (rank > 1 && rank >= size - 4) grow = 8;

    /* have a configuration allowed to simplify more on longer clauses */
    if (rank > 1 && rank >= size - 5) clause_lim = 40;

    Solver::diversify(rank, size);

    /* in case we shall not*/
    if (!use_simplification) eliminate(true);
}